

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O3

void on_read(uv_stream_t *pipe,ssize_t nread,uv_buf_t *rdbuf)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  void *pvVar4;
  ulong uVar5;
  uint uVar6;
  long *plVar7;
  long *__ptr;
  int64_t eval_b;
  int64_t eval_b_1;
  int64_t eval_a;
  long local_28 [2];
  undefined1 local_18 [16];
  
  __ptr = local_28;
  if (nread == -0xfff || 0 < nread) {
    if (nread < 1) goto LAB_001c558f;
    output_used = (int)nread + output_used;
    if (0x15555554 < (output_used * -0x55555555 + 0x2aaaaaa8U >> 2 | output_used * -0x40000000))
    goto LAB_001c558f;
    uVar5 = 0x68656c6c6f20776f;
    uVar3 = (ulong)output._0_8_ >> 0x38 | (output._0_8_ & 0xff000000000000) >> 0x28 |
            (output._0_8_ & 0xff0000000000) >> 0x18 | (output._0_8_ & 0xff00000000) >> 8 |
            (output._0_8_ & 0xff000000) << 8 | (output._0_8_ & 0xff0000) << 0x18 |
            (output._0_8_ & 0xff00) << 0x28 | output._0_8_ << 0x38;
    if (uVar3 == 0x68656c6c6f20776f) {
      uVar1 = (uint)output._8_4_ >> 0x18 | (output._8_4_ & 0xff0000) >> 8 |
              (output._8_4_ & 0xff00) << 8 | output._8_4_ << 0x18;
      uVar3 = (ulong)uVar1;
      uVar6 = 0;
      if (uVar1 != 0x726c640a) {
        uVar5 = 0x726c640a;
        goto LAB_001c550b;
      }
    }
    else {
LAB_001c550b:
      uVar6 = -(uint)(uVar5 < uVar3) | 1;
    }
    local_18._0_8_ = SEXT48((int)uVar6);
    local_28[0] = 0;
    if (local_18._0_8_ == 0) {
      local_18 = uv_buf_init(output,0xc);
      pvVar4 = malloc(200);
      iVar2 = uv_write(pvVar4,&in,local_18,1,after_write);
      local_28[0] = (long)iVar2;
      local_28[1] = 0;
      if (local_28[0] == 0) {
LAB_001c558f:
        on_read_cb_called = on_read_cb_called + 1;
        return;
      }
      goto LAB_001c55ad;
    }
  }
  else {
    on_read_cold_1();
  }
  on_read_cold_2();
LAB_001c55ad:
  plVar7 = local_28 + 1;
  on_read_cold_3();
  if ((int)plVar7 == 0) {
    free(__ptr);
    after_write_cb_called = after_write_cb_called + 1;
    return;
  }
  uVar3 = (ulong)plVar7 & 0xffffffff;
  after_write_cold_1();
  iVar2 = uv_is_closing();
  if (iVar2 != 0) {
    return;
  }
  uv_close(uVar3,0);
  return;
}

Assistant:

static void on_read(uv_stream_t* handle,
                    ssize_t nread,
                    const uv_buf_t* buf) {
  int r;
  uv_pipe_t* pipe;
  uv_handle_type pending;
  uv_buf_t outbuf;

  pipe = (uv_pipe_t*) handle;

  if (nread == 0) {
    /* Everything OK, but nothing read. */
    free(buf->base);
    return;
  }

  if (nread < 0) {
    if (nread == UV_EOF) {
      free(buf->base);
      return;
    }

    printf("error recving on channel: %s\n", uv_strerror(nread));
    abort();
  }

  fprintf(stderr, "got %d bytes\n", (int)nread);

  pending = uv_pipe_pending_type(pipe);
  if (!tcp_server_listening) {
    ASSERT_EQ(1, uv_pipe_pending_count(pipe));
    ASSERT_GT(nread, 0);
    ASSERT_NOT_NULL(buf->base);
    ASSERT_NE(pending, UV_UNKNOWN_HANDLE);
    read_cb_called++;

    /* Accept the pending TCP server, and start listening on it. */
    ASSERT_EQ(pending, UV_TCP);
    r = uv_tcp_init(uv_default_loop(), &tcp_server);
    ASSERT_OK(r);

    r = uv_accept((uv_stream_t*)pipe, (uv_stream_t*)&tcp_server);
    ASSERT_OK(r);

    r = uv_listen((uv_stream_t*)&tcp_server, BACKLOG, on_connection);
    ASSERT_OK(r);

    tcp_server_listening = 1;

    /* Make sure that the expected data is correctly multiplexed. */
    ASSERT_MEM_EQ("hello\n", buf->base, nread);

    outbuf = uv_buf_init("foobar\n", 7);
    r = uv_write(&write_req, (uv_stream_t*)pipe, &outbuf, 1, NULL);
    ASSERT_OK(r);

    /* Create a bunch of connections to get both servers to accept. */
    make_many_connections();
  } else if (memcmp("accepted_connection\n", buf->base, nread) == 0) {
    /* Remote server has accepted a connection.  Close the channel. */
    ASSERT_OK(uv_pipe_pending_count(pipe));
    ASSERT_EQ(pending, UV_UNKNOWN_HANDLE);
    remote_conn_accepted = 1;
    uv_close((uv_handle_t*)&channel, NULL);
  }

  free(buf->base);
}